

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseType(JSONParser *this,Type *out_type)

{
  Result RVar1;
  int iVar2;
  Type TVar3;
  Enum EVar4;
  string type_str;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  RVar1 = ParseString(this,&local_40);
  EVar4 = Error;
  if (RVar1.enum_ != Error) {
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar2 == 0) {
      TVar3.enum_ = I32;
      TVar3.type_index_ = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar2 == 0) {
        TVar3.enum_ = F32;
        TVar3.type_index_ = 0;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_40);
        if (iVar2 == 0) {
          TVar3.enum_ = I64;
          TVar3.type_index_ = 0;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar2 == 0) {
            TVar3.enum_ = F64;
            TVar3.type_index_ = 0;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_40);
            if (iVar2 == 0) {
              TVar3.enum_ = V128;
              TVar3.type_index_ = 0;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_40);
              if (iVar2 == 0) {
                TVar3.enum_ = I8;
                TVar3.type_index_ = 0;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_40);
                if (iVar2 == 0) {
                  TVar3.enum_ = I16;
                  TVar3.type_index_ = 0;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_40);
                  if (iVar2 == 0) {
                    TVar3.enum_ = FuncRef;
                    TVar3.type_index_ = 0;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_40);
                    if (iVar2 == 0) {
                      TVar3.enum_ = ExternRef;
                      TVar3.type_index_ = 0;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_40);
                      if (iVar2 != 0) {
                        PrintError(this,"unknown type: \"%s\"",local_40._M_dataplus._M_p);
                        goto LAB_00124880;
                      }
                      TVar3.enum_ = ExnRef;
                      TVar3.type_index_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *out_type = TVar3;
    EVar4 = Ok;
  }
LAB_00124880:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseType(Type* out_type) {
  std::string type_str;
  CHECK_RESULT(ParseString(&type_str));

  if (type_str == "i32") {
    *out_type = Type::I32;
  } else if (type_str == "f32") {
    *out_type = Type::F32;
  } else if (type_str == "i64") {
    *out_type = Type::I64;
  } else if (type_str == "f64") {
    *out_type = Type::F64;
  } else if (type_str == "v128") {
    *out_type = Type::V128;
  } else if (type_str == "i8") {
    *out_type = Type::I8;
  } else if (type_str == "i16") {
    *out_type = Type::I16;
  } else if (type_str == "funcref") {
    *out_type = Type::FuncRef;
  } else if (type_str == "externref") {
    *out_type = Type::ExternRef;
  } else if (type_str == "exnref") {
    *out_type = Type::ExnRef;
  } else {
    PrintError("unknown type: \"%s\"", type_str.c_str());
    return wabt::Result::Error;
  }
  return wabt::Result::Ok;
}